

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<duckdb::uhugeint_t,_true>::Append
          (RLECompressState<duckdb::uhugeint_t,_true> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  uhugeint_t *validity;
  uhugeint_t *in_RDX;
  UnifiedVectorFormat *in_RSI;
  idx_t idx;
  idx_t i;
  uhugeint_t *data;
  uhugeint_t *idx_00;
  
  validity = UnifiedVectorFormat::GetData<duckdb::uhugeint_t>(in_RSI);
  for (idx_00 = (uhugeint_t *)0x0; idx_00 < in_RDX;
      idx_00 = (uhugeint_t *)((long)&idx_00->lower + 1)) {
    SelectionVector::get_index(in_RSI->sel,(idx_t)idx_00);
    RLEState<duckdb::uhugeint_t>::
    Update<duckdb::RLECompressState<duckdb::uhugeint_t,true>::RLEWriter>
              ((RLEState<duckdb::uhugeint_t> *)in_RSI,in_RDX,(ValidityMask *)validity,(idx_t)idx_00)
    ;
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			state.template Update<RLECompressState<T, WRITE_STATISTICS>::RLEWriter>(data, vdata.validity, idx);
		}
	}